

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestcompareInt::runTestCase(TestValueTestcompareInt *this)

{
  TestResult *pTVar1;
  Value local_a0;
  Value local_78;
  PredicateContext local_50;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x524;
  local_50.expr_ = "checkIsLess(0, 10)";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,0);
  Json::Value::Value(&local_a0,10);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x525;
  local_50.expr_ = "checkIsEqual(10, 10)";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,10);
  Json::Value::Value(&local_a0,10);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x526;
  local_50.expr_ = "checkIsEqual(-10, -10)";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,-10);
  Json::Value::Value(&local_a0,-10);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x527;
  local_50.expr_ = "checkIsLess(-10, 0)";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,-10);
  Json::Value::Value(&local_a0,0);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareInt) {
  JSONTEST_ASSERT_PRED(checkIsLess(0, 10));
  JSONTEST_ASSERT_PRED(checkIsEqual(10, 10));
  JSONTEST_ASSERT_PRED(checkIsEqual(-10, -10));
  JSONTEST_ASSERT_PRED(checkIsLess(-10, 0));
}